

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true> __thiscall
duckdb::DuckTransactionManager::RemoveTransaction
          (DuckTransactionManager *this,DuckTransaction *transaction,bool store_transaction)

{
  transaction_t *this_00;
  atomic<unsigned_long> *this_01;
  UndoBuffer *this_02;
  iterator __first;
  DuckTransaction *pDVar1;
  size_type sVar2;
  bool bVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  pointer pDVar6;
  DatabaseManager *pDVar7;
  pointer pDVar8;
  undefined4 in_ECX;
  ulong uVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
  *this_03;
  size_type sVar11;
  ulong uVar12;
  idx_t t_idx;
  ulong uVar13;
  templated_unique_single_t *cleanup_info;
  _Head_base<0UL,_duckdb::DuckTransaction_*,_false> local_68;
  DuckTransaction *local_60;
  ulong local_58;
  undefined4 local_4c;
  size_type local_48;
  __int_type local_40;
  DuckTransaction *local_38;
  
  local_60 = (DuckTransaction *)CONCAT71(in_register_00000011,store_transaction);
  local_4c = in_ECX;
  pp_Var4 = (_func_int **)operator_new(0x20);
  pp_Var4[2] = (_func_int *)0x0;
  pp_Var4[3] = (_func_int *)0x0;
  *pp_Var4 = (_func_int *)0x0;
  pp_Var4[1] = (_func_int *)0x0;
  (this->super_TransactionManager)._vptr_TransactionManager = pp_Var4;
  this_00 = &transaction->transaction_id;
  local_48 = (long)(transaction->commit_id - transaction->transaction_id) >> 3;
  uVar12 = 0x4000000000000060;
  uVar9 = 0xffffffffffffffff;
  local_58 = 0xffffffffffffffff;
  local_38 = transaction;
  if (transaction->commit_id != transaction->transaction_id) {
    sVar11 = 0;
    uVar13 = uVar9;
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_00,sVar11);
      uVar9 = uVar13;
      sVar2 = sVar11;
      if ((pvVar5->
          super_unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::DuckTransaction_*,_std::default_delete<duckdb::DuckTransaction>_>
          .super__Head_base<0UL,_duckdb::DuckTransaction_*,_false>._M_head_impl != local_60) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                               *)this_00,sVar11);
        pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                 ::operator->(pvVar5);
        uVar10 = pDVar6->start_time;
        if (uVar12 < pDVar6->start_time) {
          uVar10 = uVar12;
        }
        pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                               *)this_00,sVar11);
        pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                 ::operator->(pvVar5);
        uVar9 = pDVar6->transaction_id;
        if (uVar13 < pDVar6->transaction_id) {
          uVar9 = uVar13;
        }
        pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                               *)this_00,sVar11);
        pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                 ::operator->(pvVar5);
        uVar13 = (pDVar6->super_Transaction).active_query.super___atomic_base<unsigned_long>._M_i;
        uVar12 = uVar10;
        sVar2 = local_48;
        if (uVar13 <= local_58) {
          local_58 = uVar13;
        }
      }
      local_48 = sVar2;
      sVar11 = sVar11 + 1;
      uVar13 = uVar9;
    } while (sVar11 < (ulong)((long)(local_38->commit_id - local_38->transaction_id) >> 3));
  }
  pDVar1 = local_38;
  sVar11 = local_48;
  LOCK();
  *(ulong *)&(local_38->super_Transaction).is_read_only = uVar12;
  UNLOCK();
  LOCK();
  (local_38->super_Transaction).active_query.super___atomic_base<unsigned_long>._M_i = uVar9;
  UNLOCK();
  pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                         *)this_00,local_48);
  local_68._M_head_impl =
       (pvVar5->
       super_unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DuckTransaction_*,_std::default_delete<duckdb::DuckTransaction>_>
       .super__Head_base<0UL,_duckdb::DuckTransaction_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DuckTransaction_*,_std::default_delete<duckdb::DuckTransaction>_>.
  super__Head_base<0UL,_duckdb::DuckTransaction_*,_false>._M_head_impl = (DuckTransaction *)0x0;
  pDVar7 = DatabaseManager::Get((AttachedDatabase *)(pDVar1->super_Transaction).manager);
  local_40 = (pDVar7->current_query_number).super___atomic_base<unsigned_long>._M_i;
  if ((char)local_4c == '\0') {
    bVar3 = DuckTransaction::ChangesMade(local_60);
    if (bVar3) {
      pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                             *)&local_68);
      pDVar6->awaiting_cleanup = true;
      pDVar8 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
               ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                             *)this);
      this_03 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                 *)&pDVar8->transactions;
      goto LAB_017e4035;
    }
  }
  else {
    if (local_60->commit_id == 0) {
      pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                             *)&local_68);
      pDVar6->highest_active_query = local_40;
      this_03 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                 *)&pDVar1->undo_buffer;
    }
    else {
      this_03 = (vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                 *)&pDVar1->catalog_version;
    }
LAB_017e4035:
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
              (this_03,(unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                        *)&local_68);
  }
  pDVar8 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>::
           operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                       *)this);
  pDVar8->lowest_start_time = uVar12;
  ::std::
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
  ::_M_erase((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
              *)this_00,
             (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
              *)(sVar11 * 8 + *this_00));
  if (*(__int_type *)&pDVar1->awaiting_cleanup !=
      (pDVar1->catalog_version).super___atomic_base<unsigned_long>._M_i) {
    this_01 = &pDVar1->catalog_version;
    sVar11 = 0;
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_01,sVar11);
      unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>::
      operator->(pvVar5);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_01,sVar11);
      pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar5);
      if (uVar12 <= pDVar6->commit_id) {
        if (sVar11 == 0) goto LAB_017e411a;
        break;
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_01,sVar11);
      pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar5);
      pDVar6->awaiting_cleanup = true;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_01,sVar11);
      pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar5);
      pDVar6->highest_active_query = local_40;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_01,sVar11);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
                ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                  *)&pDVar1->undo_buffer,pvVar5);
      sVar11 = sVar11 + 1;
    } while (sVar11 < (ulong)((long)(*(long *)&pDVar1->awaiting_cleanup -
                                    (pDVar1->catalog_version).super___atomic_base<unsigned_long>.
                                    _M_i) >> 3));
    __first._M_current =
         (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true> *)
         (this_01->super___atomic_base<unsigned_long>)._M_i;
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
    ::_M_erase((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                *)this_01,__first,__first._M_current + sVar11);
  }
LAB_017e411a:
  uVar9 = (long)(pDVar1->undo_buffer).allocator.buffer_manager -
          (long)(pDVar1->undo_buffer).transaction >> 3;
  this_02 = &pDVar1->undo_buffer;
  uVar12 = 0;
  if (pDVar1->transaction_id == pDVar1->commit_id) {
    uVar12 = uVar9;
  }
  if (uVar12 < uVar9) {
    do {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                             *)this_02,uVar12);
      pDVar6 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(pvVar5);
      if (local_58 <= pDVar6->highest_active_query) goto LAB_017e4172;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(pDVar1->undo_buffer).allocator.buffer_manager -
                              (long)(pDVar1->undo_buffer).transaction >> 3));
  }
  else {
LAB_017e4172:
    if (uVar12 == 0) goto LAB_017e41bb;
  }
  sVar11 = 0;
  do {
    pDVar8 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
             ::operator->((unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
                           *)this);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_true>
                           *)this_02,sVar11);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                *)&pDVar8->transactions,pvVar5);
    sVar11 = sVar11 + 1;
  } while (uVar12 != sVar11);
  ::std::
  vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
  ::_M_erase((vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
              *)this_02,
             (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
              *)this_02->transaction,
             (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
              *)this_02->transaction + uVar12);
LAB_017e41bb:
  if (local_68._M_head_impl != (DuckTransaction *)0x0) {
    (*((local_68._M_head_impl)->super_Transaction)._vptr_Transaction[1])();
  }
  return (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)
         (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)this;
}

Assistant:

unique_ptr<DuckCleanupInfo> DuckTransactionManager::RemoveTransaction(DuckTransaction &transaction,
                                                                      bool store_transaction) noexcept {
	auto cleanup_info = make_uniq<DuckCleanupInfo>();

	// Find the transaction in the active transactions,
	// as well as the lowest start time, transaction id, and active query.
	idx_t t_index = active_transactions.size();
	auto lowest_start_time = TRANSACTION_ID_START;
	auto lowest_transaction_id = MAX_TRANSACTION_ID;
	auto lowest_active_query = MAXIMUM_QUERY_ID;
	for (idx_t i = 0; i < active_transactions.size(); i++) {
		if (active_transactions[i].get() == &transaction) {
			t_index = i;
			continue;
		}
		lowest_start_time = MinValue(lowest_start_time, active_transactions[i]->start_time);
		lowest_transaction_id = MinValue(lowest_transaction_id, active_transactions[i]->transaction_id);
		transaction_t active_query = active_transactions[i]->active_query;
		lowest_active_query = MinValue(lowest_active_query, active_query);
	}
	lowest_active_start = lowest_start_time;
	lowest_active_id = lowest_transaction_id;
	auto lowest_stored_query = lowest_start_time;
	D_ASSERT(t_index != active_transactions.size());

	// Decide if we need to store the transaction, or if we can schedule it for cleanup.
	auto current_transaction = std::move(active_transactions[t_index]);
	auto current_query = DatabaseManager::Get(db).ActiveQueryNumber();
	if (store_transaction) {
		// If the transaction made any changes, we need to keep it around.
		if (transaction.commit_id != 0) {
			// The transaction was committed.
			// We add it to the list of recently committed transactions.
			recently_committed_transactions.push_back(std::move(current_transaction));
		} else {
			// The transaction was aborted.
			// We might still need its information; add it to the set of transactions awaiting GC.
			current_transaction->highest_active_query = current_query;
			old_transactions.push_back(std::move(current_transaction));
		}
	} else if (transaction.ChangesMade()) {
		// We do not need to store the transaction, directly schedule it for cleanup.
		current_transaction->awaiting_cleanup = true;
		cleanup_info->transactions.push_back(std::move(current_transaction));
	}
	cleanup_info->lowest_start_time = lowest_start_time;

	// Remove the transaction from the list of active transactions.
	active_transactions.unsafe_erase_at(t_index);

	// Traverse the recently_committed transactions to see if we can move any
	// to the list of transactions awaiting GC.
	idx_t i = 0;
	for (; i < recently_committed_transactions.size(); i++) {
		D_ASSERT(recently_committed_transactions[i]);
		lowest_stored_query = MinValue(recently_committed_transactions[i]->start_time, lowest_stored_query);
		if (recently_committed_transactions[i]->commit_id >= lowest_start_time) {
			// recently_committed_transactions is ordered on commit_id.
			// Thus, if the current commit_id is greater than
			// lowest_start_time, any subsequent commit IDs are also greater.
			break;
		}

		// Changes made BEFORE this transaction are no longer relevant.
		// We can schedule the transaction and its undo buffer for cleanup.
		recently_committed_transactions[i]->awaiting_cleanup = true;

		// HOWEVER: Any currently running QUERY can still be using
		// the version information of the transaction.
		// If we remove the UndoBuffer immediately, we have a race condition.

		// Store the current highest active query.
		recently_committed_transactions[i]->highest_active_query = current_query;
		// Move it to the list of transactions awaiting GC.
		old_transactions.push_back(std::move(recently_committed_transactions[i]));
	}

	if (i > 0) {
		// We moved these transactions to the list of transactions awaiting GC.
		auto start = recently_committed_transactions.begin();
		auto end = recently_committed_transactions.begin() + static_cast<int64_t>(i);
		recently_committed_transactions.erase(start, end);
	}

	// Check if we can clean up and free the memory of any old transactions.
	i = active_transactions.empty() ? old_transactions.size() : 0;
	for (; i < old_transactions.size(); i++) {
		D_ASSERT(old_transactions[i]);
		D_ASSERT(old_transactions[i]->highest_active_query > 0);
		if (old_transactions[i]->highest_active_query >= lowest_active_query) {
			// There is still a query running that could be using
			// this transactions' data.
			break;
		}
	}

	if (i > 0) {
		// We garbage-collected old transactions:
		// - Remove them from the list and schedule them for cleanup.

		// We can only safely do the actual memory cleanup when all the
		// currently active queries have finished running! (actually,
		// when all the currently active scans have finished running...).

		// Because we clean up asynchronously, we only clean up once we
		// no longer need the transaction for anything (i.e., we can move it).
		for (idx_t t_idx = 0; t_idx < i; t_idx++) {
			cleanup_info->transactions.push_back(std::move(old_transactions[t_idx]));
		}
		old_transactions.erase(old_transactions.begin(), old_transactions.begin() + static_cast<int64_t>(i));
	}

	return cleanup_info;
}